

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

sexp_conflict
sexp_signal_set_fill_x_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  int iVar1;
  sexp_conflict psVar2;
  
  if ((((ulong)arg0 & 3) == 0) && ((long)(self->value).type.id >> 1 == (ulong)arg0->tag)) {
    iVar1 = sigfillset((sigset_t *)(arg0->value).type.slots);
    return (sexp_conflict)((ulong)(iVar1 == 0) << 8 | 0x3e);
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,(long)(self->value).type.id >> 1);
  return psVar2;
}

Assistant:

sexp sexp_signal_set_fill_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  int err = 0;
  sexp res;
  if (! (sexp_pointerp(arg0) && (sexp_pointer_tag(arg0) == sexp_unbox_fixnum(sexp_opcode_arg1_type(self)))))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_opcode_arg1_type(self)), arg0);
  err = sigfillset((sigset_t*)sexp_cpointer_value(arg0));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}